

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::changeRowObj
          (SPxLPBase<double> *this,VectorBase<double> *newRowObj,bool scale)

{
  VectorBase<double> *this_00;
  int local_14;
  
  this_00 = &(this->super_LPRowSetBase<double>).object;
  VectorBase<double>::operator=(this_00,newRowObj);
  if (this->thesense == MINIMIZE) {
    VectorBase<double>::operator*=(this_00,&local_14);
  }
  return;
}

Assistant:

virtual void changeRowObj(const VectorBase<R>& newRowObj, bool scale = false)
   {
      assert(maxRowObj().dim() == newRowObj.dim());
      LPRowSetBase<R>::obj_w() = newRowObj;

      if(spxSense() == MINIMIZE)
         LPRowSetBase<R>::obj_w() *= -1;

      assert(isConsistent());
   }